

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specreaderimpl.cpp
# Opt level: O3

ssize_t __thiscall
apngasm::spec::priv::JSONSpecReaderImpl::read
          (JSONSpecReaderImpl *this,int __fd,void *__buf,size_t __nbytes)

{
  Delay DVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  optional<bool> oVar7;
  void *pvVar8;
  void *pvVar9;
  optional<unsigned_int> oVar10;
  anon_struct_8_2_43e5132c aVar11;
  undefined8 extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  undefined4 in_register_00000034;
  long lVar12;
  ulong uVar13;
  Delay delay;
  Delay defaultDelay;
  Delay delay_1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  vector<apngasm::spec::priv::Delay,_std::allocator<apngasm::spec::priv::Delay>_> delays;
  string file;
  ptree root;
  optional<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  child_1;
  path currentPath;
  path oldPath;
  undefined1 local_188 [40];
  Delay local_160;
  vector<apngasm::spec::priv::FrameInfo,_std::allocator<apngasm::spec::priv::FrameInfo>_> *local_158
  ;
  Delay local_150;
  anon_struct_8_2_43e5132c local_148;
  bool local_140 [8];
  undefined1 local_138 [32];
  void *local_118;
  iterator iStack_110;
  anon_struct_8_2_43e5132c *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [40];
  undefined1 local_b0 [48];
  path local_80;
  path local_58;
  
  local_d8._0_8_ = local_d8 + 0x10;
  local_d8._8_8_ = 0;
  local_d8[0x10] = '\0';
  local_158 = (vector<apngasm::spec::priv::FrameInfo,_std::allocator<apngasm::spec::priv::FrameInfo>_>
               *)this;
  pvVar8 = operator_new(0x20);
  pvVar9 = operator_new(0x70);
  *(void **)((long)pvVar8 + 8) = pvVar9;
  *(undefined8 *)((long)pvVar9 + 0x48) = 0;
  *(long *)((long)pvVar9 + 0x50) = (long)pvVar9 + 0x48;
  *(long *)((long)pvVar9 + 0x58) = (long)pvVar9 + 0x48;
  *(long *)((long)pvVar9 + 0x68) = (long)pvVar9 + 0x60;
  *(long *)((long)pvVar9 + 0x60) = (long)pvVar9 + 0x60;
  *(undefined8 *)((long)pvVar8 + 0x18) = 0;
  local_d8._32_8_ = pvVar8;
  std::locale::locale((locale *)local_188);
  boost::property_tree::json_parser::
  read_json<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
            ((string *)CONCAT44(in_register_00000034,__fd),
             (basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d8,(locale *)local_188);
  std::locale::~locale((locale *)local_188);
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)(local_b0 + 8),(string *)CONCAT44(in_register_00000034,__fd),auto_format);
  cVar5 = std::filesystem::__cxx11::path::has_parent_path();
  if (cVar5 != '\0') {
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::current_path((path *)local_188);
    std::filesystem::__cxx11::path::~path((path *)local_188);
  }
  DVar1 = (Delay)((long)local_188 + 0x10);
  local_188._0_8_ = DVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"name","");
  local_188[0x20] = (_List)0x2e;
  local_160.num = local_188._0_4_;
  local_160.den = local_188._4_4_;
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_140,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)local_d8,(path_type *)local_188);
  if ((Delay)local_188._0_8_ != DVar1) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  if (local_140[0] == true) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(local_158->
                super__Vector_base<apngasm::spec::priv::FrameInfo,_std::allocator<apngasm::spec::priv::FrameInfo>_>
                )._M_impl.super__Vector_impl_data._M_finish,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
  }
  if (((local_140[0] & 1U) != 0) && (local_138._0_8_ != (long)local_138 + 0x10)) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  local_188._0_8_ = DVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"loops","");
  local_188[0x20] = (_List)0x2e;
  local_160.num = local_188._0_4_;
  local_160.den = local_188._4_4_;
  oVar10 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_optional<unsigned_int>
                     ((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d8,(path_type *)local_188);
  if ((Delay)local_188._0_8_ != DVar1) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  if (((ulong)oVar10.super_type & 1) != 0) {
    *(uint *)((long)(local_158 + 1) + 0x10) = oVar10.super_type.m_storage;
  }
  local_188._0_8_ = DVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"skip_first","");
  local_188[0x20] = (_List)0x2e;
  local_160.num = local_188._0_4_;
  local_160.den = local_188._4_4_;
  oVar7 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<bool>
                    ((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_d8,(path_type *)local_188);
  if ((Delay)local_188._0_8_ != DVar1) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  if (((ushort)oVar7.super_type & 1) != 0) {
    *(bool *)((long)(local_158 + 1) + 0x14) = oVar7.super_type.m_storage;
  }
  local_150.num = 100;
  local_150.den = 1000;
  local_188._0_8_ = (long)local_188 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"default_delay","");
  local_188[0x20] = (_List)0x2e;
  local_160.num = local_188._0_4_;
  local_160.den = local_188._4_4_;
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_140,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)local_d8,(path_type *)local_188);
  if (local_188._0_8_ != (long)local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  if ((local_140[0] == true) &&
     (bVar6 = anon_unknown_0::str2delay((string *)local_138,&local_150), !bVar6)) {
    local_150.num = 100;
    local_150.den = 1000;
  }
  if ((local_140[0] == true) && (local_138._0_8_ != (long)local_138 + 0x10)) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  local_118 = (void *)0x0;
  iStack_110._M_current = (anon_struct_8_2_43e5132c *)0x0;
  local_108 = (anon_struct_8_2_43e5132c *)0x0;
  local_188._0_8_ = (long)local_188 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"delays","");
  local_188[0x20] = (_List)0x2e;
  local_160.num = local_188._0_4_;
  local_160.den = local_188._4_4_;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get_child_optional
            ((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_140,(path_type *)local_d8);
  if (local_188._0_8_ != (long)local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  if (CONCAT71(local_140._1_7_,local_140[0]) != 0) {
    lVar3 = *(long *)(*(long *)(CONCAT71(local_140._1_7_,local_140[0]) + 0x20) + 8);
    lVar12 = *(long *)(lVar3 + 0x68) + -0x60;
    if (*(long *)(lVar3 + 0x68) == 0) {
      lVar12 = 0;
    }
    if (lVar12 != lVar3) {
      do {
        bVar6 = anon_unknown_0::str2delay((string *)(lVar12 + 0x20),(Delay *)local_188);
        if (!bVar6) {
          local_188._0_4_ = local_150.num;
          local_188._4_4_ = local_150.den;
        }
        if (iStack_110._M_current == local_108) {
          std::vector<apngasm::spec::priv::Delay,std::allocator<apngasm::spec::priv::Delay>>::
          _M_realloc_insert<apngasm::spec::priv::Delay_const&>
                    ((vector<apngasm::spec::priv::Delay,std::allocator<apngasm::spec::priv::Delay>>
                      *)&local_118,iStack_110,(anon_struct_8_2_43e5132c *)local_188);
        }
        else {
          (iStack_110._M_current)->num = local_188._0_4_;
          (iStack_110._M_current)->den = local_188._4_4_;
          iStack_110._M_current = iStack_110._M_current + 1;
        }
        plVar2 = (long *)(lVar12 + 0x68);
        lVar12 = *plVar2 + -0x60;
        if (*plVar2 == 0) {
          lVar12 = 0;
        }
      } while (lVar12 != lVar3);
    }
  }
  local_188._0_8_ = (long)local_188 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"frames","");
  local_188[0x20] = 0x2e;
  local_160.num = local_188._0_4_;
  local_160.den = local_188._4_4_;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get_child_optional
            ((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b0,(path_type *)local_d8);
  if (local_188._0_8_ != (long)local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  if ((char *)local_b0._0_8_ != (char *)0x0) {
    lVar3 = *(long *)(*(long *)(local_b0._0_8_ + 0x20) + 8);
    lVar12 = *(long *)(lVar3 + 0x68) + -0x60;
    if (*(long *)(lVar3 + 0x68) == 0) {
      lVar12 = 0;
    }
    if (lVar12 != lVar3) {
      local_158 = local_158 + 2;
      uVar13 = 0;
      do {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_local_buf[0] = '\0';
        if (*(long *)(*(long *)(lVar12 + 0x40) + 0x18) == 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lVar12 + 0x20));
          aVar11 = (anon_struct_8_2_43e5132c)local_150;
          if (uVar13 < (ulong)((long)iStack_110._M_current - (long)local_118 >> 3)) {
            aVar11 = *(anon_struct_8_2_43e5132c *)((long)local_118 + uVar13 * 8);
          }
LAB_00155952:
          local_148 = aVar11;
        }
        else {
          lVar4 = *(long *)(*(long *)(*(long *)(lVar12 + 0x40) + 8) + 0x68);
          __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (lVar4 + -0x60);
          if (lVar4 == 0) {
            __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_f8,__str);
          bVar6 = anon_unknown_0::str2delay(__str + 1,(Delay *)&local_148);
          aVar11 = (anon_struct_8_2_43e5132c)local_150;
          if (!bVar6) goto LAB_00155952;
        }
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_58,&local_f8,auto_format);
        std::filesystem::absolute((path *)local_140);
        local_188._0_8_ = (long)local_188 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_188,CONCAT71(local_140._1_7_,local_140[0]),
                   (undefined1 *)(local_138._0_8_ + CONCAT71(local_140._1_7_,local_140[0])));
        local_188._32_4_ = local_148.num;
        local_188._36_4_ = local_148.den;
        std::filesystem::__cxx11::path::~path((path *)local_140);
        std::filesystem::__cxx11::path::~path(&local_58);
        std::vector<apngasm::spec::priv::FrameInfo,_std::allocator<apngasm::spec::priv::FrameInfo>_>
        ::push_back(local_158,(value_type *)local_188);
        if (local_188._0_8_ != (long)local_188 + 0x10) {
          operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                   local_f8.field_2._M_local_buf[0]) + 1);
        }
        plVar2 = (long *)(lVar12 + 0x68);
        lVar12 = *plVar2 + -0x60;
        if (*plVar2 == 0) {
          lVar12 = 0;
        }
        uVar13 = uVar13 + 1;
      } while (lVar12 != lVar3);
    }
  }
  std::filesystem::current_path(&local_80);
  if (local_118 != (void *)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  std::filesystem::__cxx11::path::~path((path *)(local_b0 + 8));
  std::filesystem::__cxx11::path::~path(&local_80);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d8);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool JSONSpecReaderImpl::read(const std::string& filePath)
      {
        // Read JSON file.
        boost::property_tree::ptree root;
        boost::property_tree::read_json(filePath, root);

        // Set current directory.
        const std::filesystem::path oldPath = std::filesystem::current_path();
        const std::filesystem::path currentPath = std::filesystem::path(filePath);
        if(currentPath.has_parent_path())
          std::filesystem::current_path(currentPath.parent_path());

        // Read fields.
        // name
        if( boost::optional<std::string> value = root.get_optional<std::string>("name") )
        {
          _name = value.get();
        }

        // loops
        if( boost::optional<unsigned int> value = root.get_optional<unsigned int>("loops") )
        {
          _loops = value.get();
        }

        // skip_first
        if( boost::optional<bool> value = root.get_optional<bool>("skip_first") )
        {
          _skipFirst = value.get();
        }

        // delay
        Delay defaultDelay = { DEFAULT_FRAME_NUMERATOR, DEFAULT_FRAME_DENOMINATOR };
        if( boost::optional<std::string> value = root.get_optional<std::string>("default_delay") )
        {
          if( !str2delay(value.get(), &defaultDelay) )
          {
            defaultDelay.num = DEFAULT_FRAME_NUMERATOR;
            defaultDelay.den = DEFAULT_FRAME_DENOMINATOR;
          }
        }

        std::vector<Delay> delays;
        if( boost::optional<boost::property_tree::ptree&> child = root.get_child_optional("delays") )
        {
          BOOST_FOREACH(const boost::property_tree::ptree::value_type& current, child.get())
          {
            Delay delay;
            if( !str2delay(current.second.data(), &delay) )
              delay = defaultDelay;
            delays.push_back(delay);
          }
        }

        // frames
        if( boost::optional<boost::property_tree::ptree&> child = root.get_child_optional("frames") )
        {
          int delayIndex = 0;
          BOOST_FOREACH(const boost::property_tree::ptree::value_type& current, child.get())
          {
            std::string file;
            Delay delay;
            const boost::property_tree::ptree& frame = current.second;

            // filepath only.
            if(frame.empty())
            {
              file = frame.data();
              if(delayIndex < delays.size())
                delay = delays[delayIndex];
              else
                delay = defaultDelay;
            }

            // filepath and delay
            else
            {
              const boost::property_tree::ptree::value_type& value = frame.front();
              file = value.first;
              if( !str2delay(value.second.data(), &delay) )
                delay = defaultDelay;
            }

            // Add frame informations.
            const FrameInfo frameInfo = { std::filesystem::absolute(file).string(), delay };
            _frameInfos.push_back(frameInfo);

            ++delayIndex;
          }
        }

        // Reset current directory.
        std::filesystem::current_path(oldPath);

        return true;
      }